

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drawing.cpp
# Opt level: O2

void QtMWidgets::drawCylinder
               (QPainter *p,QRect *r,QColor *baseColor,bool roundLeftCorner,bool roundRightCorner)

{
  int iVar1;
  QColor QVar2;
  QPointF local_168;
  QLinearGradient backgroundGradient;
  QLinearGradient secondVertLineGradient;
  QLinearGradient firstVertLineGradient;
  QPointF local_48;
  
  _secondVertLineGradient = 0.0;
  _backgroundGradient = 0.0;
  QLinearGradient::QLinearGradient
            (&firstVertLineGradient,(QPointF *)&secondVertLineGradient,
             (QPointF *)&backgroundGradient);
  QGradient::setCoordinateMode((CoordinateMode)&firstVertLineGradient);
  QVar2 = darkerColor(baseColor,0x32);
  _secondVertLineGradient = QVar2._0_8_;
  QGradient::setColorAt(0.0,(QColor *)&firstVertLineGradient);
  QVar2 = lighterColor(baseColor,0x19);
  _secondVertLineGradient = QVar2._0_8_;
  QGradient::setColorAt(0.5,(QColor *)&firstVertLineGradient);
  QVar2 = darkerColor(baseColor,0x32);
  _secondVertLineGradient = QVar2._0_8_;
  QGradient::setColorAt(1.0,(QColor *)&firstVertLineGradient);
  _backgroundGradient = 0.0;
  local_168.xp = 0.0;
  local_168.yp = 1.0;
  QLinearGradient::QLinearGradient
            (&secondVertLineGradient,(QPointF *)&backgroundGradient,&local_168);
  QGradient::setCoordinateMode((CoordinateMode)&secondVertLineGradient);
  QVar2 = darkerColor(baseColor,0x28);
  _backgroundGradient = QVar2._0_8_;
  QGradient::setColorAt(0.0,(QColor *)&secondVertLineGradient);
  QVar2 = lighterColor(baseColor,0x32);
  _backgroundGradient = QVar2._0_8_;
  QGradient::setColorAt(0.5,(QColor *)&secondVertLineGradient);
  QVar2 = darkerColor(baseColor,0x28);
  _backgroundGradient = QVar2._0_8_;
  QGradient::setColorAt(1.0,(QColor *)&secondVertLineGradient);
  QPainter::setPen((PenStyle)p);
  QBrush::QBrush((QBrush *)&backgroundGradient,(QGradient *)&firstVertLineGradient);
  QPainter::setBrush((QBrush *)p);
  QBrush::~QBrush((QBrush *)&backgroundGradient);
  QPainter::drawRect(p,r->x1,(uint)roundLeftCorner + (uint)roundLeftCorner,1,
                     (((uint)!roundLeftCorner * 4 + r->y2) - r->y1) + -3);
  QPainter::drawRect(p,r->x2,(uint)roundRightCorner * 2,1,
                     (((uint)!roundRightCorner * 4 + r->y2) - r->y1) + -3);
  QBrush::QBrush((QBrush *)&backgroundGradient,(QGradient *)&secondVertLineGradient);
  QPainter::setBrush((QBrush *)p);
  QBrush::~QBrush((QBrush *)&backgroundGradient);
  iVar1 = (r->y2 - r->y1) + 1;
  if (roundLeftCorner) {
    iVar1 = ~r->y1 + r->y2;
  }
  QPainter::drawRect(p,r->x1 + 1,(uint)roundLeftCorner,1,iVar1);
  iVar1 = (r->y2 - r->y1) + 1;
  if (roundRightCorner) {
    iVar1 = ~r->y1 + r->y2;
  }
  QPainter::drawRect(p,r->x2 + -1,(uint)roundRightCorner,1,iVar1);
  QPainter::drawRect(p,r->x1 + 2,0,1,(r->y2 - r->y1) + 1);
  QPainter::drawRect(p,r->x2 + -2,0,1,(r->y2 - r->y1) + 1);
  local_168.xp = 0.0;
  local_168.yp = 0.0;
  local_48.xp._0_4_ = 0;
  local_48.xp._4_4_ = 0;
  local_48.yp._0_4_ = 0;
  local_48.yp._4_4_ = 0x3ff00000;
  QLinearGradient::QLinearGradient(&backgroundGradient,&local_168,&local_48);
  QGradient::setCoordinateMode((CoordinateMode)&backgroundGradient);
  QGradient::setColorAt(0.0,(QColor *)&backgroundGradient);
  QVar2 = lighterColor(baseColor,0x4b);
  local_168.xp = QVar2._0_8_;
  local_168.yp._0_6_ = QVar2.ct._4_6_;
  QGradient::setColorAt(0.15,(QColor *)&backgroundGradient);
  QVar2 = lighterColor(baseColor,200);
  local_168.xp = QVar2._0_8_;
  local_168.yp._0_6_ = QVar2.ct._4_6_;
  QGradient::setColorAt(0.5,(QColor *)&backgroundGradient);
  QVar2 = lighterColor(baseColor,0x4b);
  local_168.xp = QVar2._0_8_;
  local_168.yp._0_6_ = QVar2.ct._4_6_;
  QGradient::setColorAt(0.85,(QColor *)&backgroundGradient);
  QGradient::setColorAt(1.0,(QColor *)&backgroundGradient);
  QPainter::setPen((PenStyle)p);
  QBrush::QBrush((QBrush *)&local_168,(QGradient *)&backgroundGradient);
  QPainter::setBrush((QBrush *)p);
  QBrush::~QBrush((QBrush *)&local_168);
  QPainter::drawRect(p,r->x1 + 3,0,(r->x2 - r->x1) + -5,(r->y2 - r->y1) + 1);
  QLinearGradient::~QLinearGradient(&backgroundGradient);
  QLinearGradient::~QLinearGradient(&secondVertLineGradient);
  QLinearGradient::~QLinearGradient(&firstVertLineGradient);
  return;
}

Assistant:

void
drawCylinder( QPainter * p, const QRect & r, const QColor & baseColor,
	bool roundLeftCorner, bool roundRightCorner )
{
	QLinearGradient firstVertLineGradient( QPointF( 0.0, 0.0 ),
		QPointF( 0.0, 1.0 ) );
	firstVertLineGradient.setCoordinateMode( QGradient::ObjectBoundingMode );
	firstVertLineGradient.setColorAt( 0.0, darkerColor( baseColor, 50 ) );
	firstVertLineGradient.setColorAt( 0.5, lighterColor( baseColor, 25 ) );
	firstVertLineGradient.setColorAt( 1.0, darkerColor( baseColor, 50 ) );

	QLinearGradient secondVertLineGradient( QPointF( 0.0, 0.0 ),
		QPointF( 0.0, 1.0 ) );
	secondVertLineGradient.setCoordinateMode( QGradient::ObjectBoundingMode );
	secondVertLineGradient.setColorAt( 0.0, darkerColor( baseColor, 40 ) );
	secondVertLineGradient.setColorAt( 0.5, lighterColor( baseColor, 50 ) );
	secondVertLineGradient.setColorAt( 1.0, darkerColor( baseColor, 40 ) );

	p->setPen( Qt::NoPen );
	p->setBrush( firstVertLineGradient );

	p->drawRect( r.x(), roundLeftCorner ? 2 : 0,
		1, roundLeftCorner ? r.height() - 4 : r.height() );
	p->drawRect( r.x() + r.width() - 1, roundRightCorner ? 2 : 0,
		1, roundRightCorner ? r.height() - 4 : r.height() );

	p->setBrush( secondVertLineGradient );

	p->drawRect( r.x() + 1, roundLeftCorner ? 1 : 0,
		1, roundLeftCorner ? r.height() - 2 : r.height() );
	p->drawRect( r.x() + r.width() - 2, roundRightCorner ? 1 : 0,
		1, roundRightCorner ? r.height() - 2 : r.height() );

	p->drawRect( r.x() + 2, 0, 1, r.height() );
	p->drawRect( r.x() + r.width() - 3, 0,
		1, r.height() );

	QLinearGradient backgroundGradient( QPointF( 0.0, 0.0 ),
		QPointF( 0.0, 1.0 ) );
	backgroundGradient.setCoordinateMode( QGradient::ObjectBoundingMode );
	backgroundGradient.setColorAt( 0.0, baseColor );
	backgroundGradient.setColorAt( 0.15, lighterColor( baseColor, 75 ) );
	backgroundGradient.setColorAt( 0.5, lighterColor( baseColor, 200 ) );
	backgroundGradient.setColorAt( 0.85, lighterColor( baseColor, 75 ) );
	backgroundGradient.setColorAt( 1.0, baseColor );

	p->setPen( Qt::NoPen );
	p->setBrush( backgroundGradient );
	p->drawRect( r.x() + 3, 0, r.width() - 2 * 3, r.height() );
}